

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O0

void idct64_stage6_high32_sse2(__m128i *x,int32_t *cospi,__m128i __rounding,int8_t cos_bit)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  uint uVar105;
  int iVar106;
  char in_DL;
  long in_RSI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM0_Qb;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  __m128i v1_7;
  __m128i v0_7;
  __m128i u1_7;
  __m128i u0_7;
  __m128i t1_7;
  __m128i t0_7;
  __m128i d1_6;
  __m128i d0_6;
  __m128i c1_6;
  __m128i c0_6;
  __m128i b1_6;
  __m128i b0_6;
  __m128i a1_6;
  __m128i a0_6;
  __m128i v1_6;
  __m128i v0_6;
  __m128i u1_6;
  __m128i u0_6;
  __m128i t1_6;
  __m128i t0_6;
  __m128i d1_5;
  __m128i d0_5;
  __m128i c1_5;
  __m128i c0_5;
  __m128i b1_5;
  __m128i b0_5;
  __m128i a1_5;
  __m128i a0_5;
  __m128i v1_5;
  __m128i v0_5;
  __m128i u1_5;
  __m128i u0_5;
  __m128i t1_5;
  __m128i t0_5;
  __m128i d1_4;
  __m128i d0_4;
  __m128i c1_4;
  __m128i c0_4;
  __m128i b1_4;
  __m128i b0_4;
  __m128i a1_4;
  __m128i a0_4;
  __m128i v1_4;
  __m128i v0_4;
  __m128i u1_4;
  __m128i u0_4;
  __m128i t1_4;
  __m128i t0_4;
  __m128i d1_3;
  __m128i d0_3;
  __m128i c1_3;
  __m128i c0_3;
  __m128i b1_3;
  __m128i b0_3;
  __m128i a1_3;
  __m128i a0_3;
  __m128i v1_3;
  __m128i v0_3;
  __m128i u1_3;
  __m128i u0_3;
  __m128i t1_3;
  __m128i t0_3;
  __m128i d1_2;
  __m128i d0_2;
  __m128i c1_2;
  __m128i c0_2;
  __m128i b1_2;
  __m128i b0_2;
  __m128i a1_2;
  __m128i a0_2;
  __m128i v1_2;
  __m128i v0_2;
  __m128i u1_2;
  __m128i u0_2;
  __m128i t1_2;
  __m128i t0_2;
  __m128i d1_1;
  __m128i d0_1;
  __m128i c1_1;
  __m128i c0_1;
  __m128i b1_1;
  __m128i b0_1;
  __m128i a1_1;
  __m128i a0_1;
  __m128i v1_1;
  __m128i v0_1;
  __m128i u1_1;
  __m128i u0_1;
  __m128i t1_1;
  __m128i t0_1;
  __m128i d1;
  __m128i d0;
  __m128i c1;
  __m128i c0;
  __m128i b1;
  __m128i b0;
  __m128i a1;
  __m128i a0;
  __m128i v1;
  __m128i v0;
  __m128i u1;
  __m128i u0;
  __m128i t1;
  __m128i t0;
  __m128i cospi_m24_m40;
  __m128i cospi_p24_p40;
  __m128i cospi_m40_p24;
  __m128i cospi_m56_m08;
  __m128i cospi_p56_p08;
  __m128i cospi_m08_p56;
  undefined2 local_10c8;
  undefined2 uStack_10c6;
  undefined2 uStack_10c4;
  undefined2 uStack_10c2;
  undefined2 local_10b8;
  undefined2 uStack_10b6;
  undefined2 uStack_10b4;
  undefined2 uStack_10b2;
  undefined2 local_10a8;
  undefined2 uStack_10a6;
  undefined2 uStack_10a4;
  undefined2 uStack_10a2;
  undefined2 local_1098;
  undefined2 uStack_1096;
  undefined2 uStack_1094;
  undefined2 uStack_1092;
  undefined2 local_1088;
  undefined2 uStack_1086;
  undefined2 uStack_1084;
  undefined2 uStack_1082;
  undefined2 local_1078;
  undefined2 uStack_1076;
  undefined2 uStack_1074;
  undefined2 uStack_1072;
  undefined2 local_1068;
  undefined2 uStack_1066;
  undefined2 uStack_1064;
  undefined2 uStack_1062;
  undefined2 local_1058;
  undefined2 uStack_1056;
  undefined2 uStack_1054;
  undefined2 uStack_1052;
  undefined2 local_1048;
  undefined2 uStack_1046;
  undefined2 uStack_1044;
  undefined2 uStack_1042;
  undefined2 local_1038;
  undefined2 uStack_1036;
  undefined2 uStack_1034;
  undefined2 uStack_1032;
  undefined2 local_1028;
  undefined2 uStack_1026;
  undefined2 uStack_1024;
  undefined2 uStack_1022;
  undefined2 local_1018;
  undefined2 uStack_1016;
  undefined2 uStack_1014;
  undefined2 uStack_1012;
  undefined2 local_1008;
  undefined2 uStack_1006;
  undefined2 uStack_1004;
  undefined2 uStack_1002;
  undefined2 local_ff8;
  undefined2 uStack_ff6;
  undefined2 uStack_ff4;
  undefined2 uStack_ff2;
  undefined2 local_fe8;
  undefined2 uStack_fe6;
  undefined2 uStack_fe4;
  undefined2 uStack_fe2;
  undefined2 local_fd8;
  undefined2 uStack_fd6;
  undefined2 uStack_fd4;
  undefined2 uStack_fd2;
  undefined2 uStack_fc0;
  undefined2 uStack_fbe;
  undefined2 uStack_fbc;
  undefined2 uStack_fba;
  undefined2 uStack_fb0;
  undefined2 uStack_fae;
  undefined2 uStack_fac;
  undefined2 uStack_faa;
  undefined2 uStack_fa0;
  undefined2 uStack_f9e;
  undefined2 uStack_f9c;
  undefined2 uStack_f9a;
  undefined2 uStack_f90;
  undefined2 uStack_f8e;
  undefined2 uStack_f8c;
  undefined2 uStack_f8a;
  undefined2 uStack_f80;
  undefined2 uStack_f7e;
  undefined2 uStack_f7c;
  undefined2 uStack_f7a;
  undefined2 uStack_f70;
  undefined2 uStack_f6e;
  undefined2 uStack_f6c;
  undefined2 uStack_f6a;
  undefined2 uStack_f60;
  undefined2 uStack_f5e;
  undefined2 uStack_f5c;
  undefined2 uStack_f5a;
  undefined2 uStack_f50;
  undefined2 uStack_f4e;
  undefined2 uStack_f4c;
  undefined2 uStack_f4a;
  undefined2 uStack_f40;
  undefined2 uStack_f3e;
  undefined2 uStack_f3c;
  undefined2 uStack_f3a;
  undefined2 uStack_f30;
  undefined2 uStack_f2e;
  undefined2 uStack_f2c;
  undefined2 uStack_f2a;
  undefined2 uStack_f20;
  undefined2 uStack_f1e;
  undefined2 uStack_f1c;
  undefined2 uStack_f1a;
  undefined2 uStack_f10;
  undefined2 uStack_f0e;
  undefined2 uStack_f0c;
  undefined2 uStack_f0a;
  undefined2 uStack_f00;
  undefined2 uStack_efe;
  undefined2 uStack_efc;
  undefined2 uStack_efa;
  undefined2 uStack_ef0;
  undefined2 uStack_eee;
  undefined2 uStack_eec;
  undefined2 uStack_eea;
  undefined2 uStack_ee0;
  undefined2 uStack_ede;
  undefined2 uStack_edc;
  undefined2 uStack_eda;
  undefined2 uStack_ed0;
  undefined2 uStack_ece;
  undefined2 uStack_ecc;
  undefined2 uStack_eca;
  undefined4 local_ab8;
  undefined4 uStack_ab4;
  undefined4 uStack_ab0;
  undefined4 uStack_aac;
  undefined4 local_a98;
  undefined4 uStack_a94;
  undefined4 uStack_a90;
  undefined4 uStack_a8c;
  undefined4 local_a78;
  undefined4 uStack_a74;
  undefined4 uStack_a70;
  undefined4 uStack_a6c;
  undefined4 local_a58;
  undefined4 uStack_a54;
  undefined4 uStack_a50;
  undefined4 uStack_a4c;
  undefined4 local_a38;
  undefined4 uStack_a34;
  undefined4 uStack_a30;
  undefined4 uStack_a2c;
  undefined4 local_a18;
  undefined4 uStack_a14;
  undefined4 uStack_a10;
  undefined4 uStack_a0c;
  undefined4 local_9f8;
  undefined4 uStack_9f4;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  undefined4 local_9d8;
  undefined4 uStack_9d4;
  undefined4 uStack_9d0;
  undefined4 uStack_9cc;
  undefined4 local_9b8;
  undefined4 uStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 local_998;
  undefined4 uStack_994;
  undefined4 uStack_990;
  undefined4 uStack_98c;
  undefined4 local_978;
  undefined4 uStack_974;
  undefined4 uStack_970;
  undefined4 uStack_96c;
  undefined4 local_958;
  undefined4 uStack_954;
  undefined4 uStack_950;
  undefined4 uStack_94c;
  undefined4 local_938;
  undefined4 uStack_934;
  undefined4 uStack_930;
  undefined4 uStack_92c;
  undefined4 local_918;
  undefined4 uStack_914;
  undefined4 uStack_910;
  undefined4 uStack_90c;
  undefined4 local_8f8;
  undefined4 uStack_8f4;
  undefined4 uStack_8f0;
  undefined4 uStack_8ec;
  undefined4 local_8d8;
  undefined4 uStack_8d4;
  undefined4 uStack_8d0;
  undefined4 uStack_8cc;
  undefined4 local_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 local_898;
  undefined4 uStack_894;
  undefined4 uStack_890;
  undefined4 uStack_88c;
  undefined4 local_878;
  undefined4 uStack_874;
  undefined4 uStack_870;
  undefined4 uStack_86c;
  undefined4 local_858;
  undefined4 uStack_854;
  undefined4 uStack_850;
  undefined4 uStack_84c;
  undefined4 local_838;
  undefined4 uStack_834;
  undefined4 uStack_830;
  undefined4 uStack_82c;
  undefined4 local_818;
  undefined4 uStack_814;
  undefined4 uStack_810;
  undefined4 uStack_80c;
  undefined4 local_7f8;
  undefined4 uStack_7f4;
  undefined4 uStack_7f0;
  undefined4 uStack_7ec;
  undefined4 local_7d8;
  undefined4 uStack_7d4;
  undefined4 uStack_7d0;
  undefined4 uStack_7cc;
  undefined4 local_7b8;
  undefined4 uStack_7b4;
  undefined4 uStack_7b0;
  undefined4 uStack_7ac;
  undefined4 local_798;
  undefined4 uStack_794;
  undefined4 uStack_790;
  undefined4 uStack_78c;
  undefined4 local_778;
  undefined4 uStack_774;
  undefined4 uStack_770;
  undefined4 uStack_76c;
  undefined4 local_758;
  undefined4 uStack_754;
  undefined4 uStack_750;
  undefined4 uStack_74c;
  undefined4 local_738;
  undefined4 uStack_734;
  undefined4 uStack_730;
  undefined4 uStack_72c;
  undefined4 local_718;
  undefined4 uStack_714;
  undefined4 uStack_710;
  undefined4 uStack_70c;
  undefined4 local_6f8;
  undefined4 uStack_6f4;
  undefined4 uStack_6f0;
  undefined4 uStack_6ec;
  undefined4 local_6e8;
  undefined4 uStack_6e4;
  undefined4 uStack_6e0;
  undefined4 uStack_6dc;
  undefined4 local_6d8;
  undefined4 uStack_6d4;
  undefined4 uStack_6d0;
  undefined4 uStack_6cc;
  __m128i d1_7;
  __m128i d0_7;
  __m128i c1_7;
  __m128i c0_7;
  __m128i b1_7;
  __m128i b0_7;
  __m128i a1_7;
  __m128i a0_7;
  
  uVar105 = -*(int *)(in_RSI + 0x20) & 0xffffU | *(int *)(in_RSI + 0xe0) << 0x10;
  uVar93 = CONCAT44(uVar105,uVar105);
  uVar94 = CONCAT44(uVar105,uVar105);
  uVar105 = (uint)*(ushort *)(in_RSI + 0xe0) | *(int *)(in_RSI + 0x20) << 0x10;
  uVar95 = CONCAT44(uVar105,uVar105);
  uVar96 = CONCAT44(uVar105,uVar105);
  iVar106 = (-*(int *)(in_RSI + 0xe0) & 0xffffU) + *(int *)(in_RSI + 0x20) * -0x10000;
  uVar97 = CONCAT44(iVar106,iVar106);
  uVar98 = CONCAT44(iVar106,iVar106);
  uVar105 = -*(int *)(in_RSI + 0xa0) & 0xffffU | *(int *)(in_RSI + 0x60) << 0x10;
  uVar99 = CONCAT44(uVar105,uVar105);
  uVar100 = CONCAT44(uVar105,uVar105);
  uVar105 = (uint)*(ushort *)(in_RSI + 0x60) | *(int *)(in_RSI + 0xa0) << 0x10;
  uVar101 = CONCAT44(uVar105,uVar105);
  uVar102 = CONCAT44(uVar105,uVar105);
  iVar106 = (-*(int *)(in_RSI + 0x60) & 0xffffU) + *(int *)(in_RSI + 0xa0) * -0x10000;
  uVar103 = CONCAT44(iVar106,iVar106);
  uVar104 = CONCAT44(iVar106,iVar106);
  uVar1 = *(undefined8 *)(in_RDI + 0x220);
  uVar2 = *(undefined8 *)(in_RDI + 0x3d0);
  local_fd8 = (undefined2)uVar1;
  uStack_fd6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_fd4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_fd2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_fe8 = (undefined2)uVar2;
  uStack_fe6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_fe4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_fe2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x228);
  uVar2 = *(undefined8 *)(in_RDI + 0x3d8);
  uStack_ed0 = (undefined2)uVar1;
  uStack_ece = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_ecc = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_eca = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_ee0 = (undefined2)uVar2;
  uStack_ede = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_edc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_eda = (undefined2)((ulong)uVar2 >> 0x30);
  auVar60._2_2_ = local_fe8;
  auVar60._0_2_ = local_fd8;
  auVar60._4_2_ = uStack_fd6;
  auVar60._6_2_ = uStack_fe6;
  auVar60._10_2_ = uStack_fe4;
  auVar60._8_2_ = uStack_fd4;
  auVar60._12_2_ = uStack_fd2;
  auVar60._14_2_ = uStack_fe2;
  auVar59._8_8_ = uVar94;
  auVar59._0_8_ = uVar93;
  auVar107 = pmaddwd(auVar60,auVar59);
  auVar58._2_2_ = uStack_ee0;
  auVar58._0_2_ = uStack_ed0;
  auVar58._4_2_ = uStack_ece;
  auVar58._6_2_ = uStack_ede;
  auVar58._10_2_ = uStack_edc;
  auVar58._8_2_ = uStack_ecc;
  auVar58._12_2_ = uStack_eca;
  auVar58._14_2_ = uStack_eda;
  auVar57._8_8_ = uVar94;
  auVar57._0_8_ = uVar93;
  auVar108 = pmaddwd(auVar58,auVar57);
  auVar56._2_2_ = local_fe8;
  auVar56._0_2_ = local_fd8;
  auVar56._4_2_ = uStack_fd6;
  auVar56._6_2_ = uStack_fe6;
  auVar56._10_2_ = uStack_fe4;
  auVar56._8_2_ = uStack_fd4;
  auVar56._12_2_ = uStack_fd2;
  auVar56._14_2_ = uStack_fe2;
  auVar55._8_8_ = uVar96;
  auVar55._0_8_ = uVar95;
  auVar109 = pmaddwd(auVar56,auVar55);
  auVar54._2_2_ = uStack_ee0;
  auVar54._0_2_ = uStack_ed0;
  auVar54._4_2_ = uStack_ece;
  auVar54._6_2_ = uStack_ede;
  auVar54._10_2_ = uStack_edc;
  auVar54._8_2_ = uStack_ecc;
  auVar54._12_2_ = uStack_eca;
  auVar54._14_2_ = uStack_eda;
  auVar53._8_8_ = uVar96;
  auVar53._0_8_ = uVar95;
  auVar110 = pmaddwd(auVar54,auVar53);
  local_6d8 = auVar107._0_4_;
  uStack_6d4 = auVar107._4_4_;
  uStack_6d0 = auVar107._8_4_;
  uStack_6cc = auVar107._12_4_;
  local_6e8 = (int)in_XMM0_Qa;
  uStack_6e4 = (int)((ulong)in_XMM0_Qa >> 0x20);
  uStack_6e0 = (int)in_XMM0_Qb;
  uStack_6dc = (int)((ulong)in_XMM0_Qb >> 0x20);
  local_6f8 = auVar108._0_4_;
  uStack_6f4 = auVar108._4_4_;
  uStack_6f0 = auVar108._8_4_;
  uStack_6ec = auVar108._12_4_;
  local_718 = auVar109._0_4_;
  uStack_714 = auVar109._4_4_;
  uStack_710 = auVar109._8_4_;
  uStack_70c = auVar109._12_4_;
  local_738 = auVar110._0_4_;
  uStack_734 = auVar110._4_4_;
  uStack_730 = auVar110._8_4_;
  uStack_72c = auVar110._12_4_;
  auVar107 = ZEXT416((uint)(int)in_DL);
  auVar108 = ZEXT416((uint)(int)in_DL);
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar92._4_4_ = uStack_6d4 + uStack_6e4 >> auVar107;
  auVar92._0_4_ = local_6d8 + local_6e8 >> auVar107;
  auVar92._12_4_ = uStack_6cc + uStack_6dc >> auVar107;
  auVar92._8_4_ = uStack_6d0 + uStack_6e0 >> auVar107;
  auVar91._4_4_ = uStack_6f4 + uStack_6e4 >> auVar108;
  auVar91._0_4_ = local_6f8 + local_6e8 >> auVar108;
  auVar91._12_4_ = uStack_6ec + uStack_6dc >> auVar108;
  auVar91._8_4_ = uStack_6f0 + uStack_6e0 >> auVar108;
  auVar107 = packssdw(auVar92,auVar91);
  *(undefined1 (*) [16])(in_RDI + 0x220) = auVar107;
  auVar90._4_4_ = uStack_714 + uStack_6e4 >> auVar109;
  auVar90._0_4_ = local_718 + local_6e8 >> auVar109;
  auVar90._12_4_ = uStack_70c + uStack_6dc >> auVar109;
  auVar90._8_4_ = uStack_710 + uStack_6e0 >> auVar109;
  auVar89._4_4_ = uStack_734 + uStack_6e4 >> auVar110;
  auVar89._0_4_ = local_738 + local_6e8 >> auVar110;
  auVar89._12_4_ = uStack_72c + uStack_6dc >> auVar110;
  auVar89._8_4_ = uStack_730 + uStack_6e0 >> auVar110;
  auVar107 = packssdw(auVar90,auVar89);
  *(undefined1 (*) [16])(in_RDI + 0x3d0) = auVar107;
  uVar1 = *(undefined8 *)(in_RDI + 0x230);
  uVar2 = *(undefined8 *)(in_RDI + 0x3c0);
  local_ff8 = (undefined2)uVar1;
  uStack_ff6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_ff4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_ff2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1008 = (undefined2)uVar2;
  uStack_1006 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1004 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1002 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x238);
  uVar2 = *(undefined8 *)(in_RDI + 0x3c8);
  uStack_ef0 = (undefined2)uVar1;
  uStack_eee = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_eec = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_eea = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_f00 = (undefined2)uVar2;
  uStack_efe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_efc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_efa = (undefined2)((ulong)uVar2 >> 0x30);
  auVar52._2_2_ = local_1008;
  auVar52._0_2_ = local_ff8;
  auVar52._4_2_ = uStack_ff6;
  auVar52._6_2_ = uStack_1006;
  auVar52._10_2_ = uStack_1004;
  auVar52._8_2_ = uStack_ff4;
  auVar52._12_2_ = uStack_ff2;
  auVar52._14_2_ = uStack_1002;
  auVar51._8_8_ = uVar94;
  auVar51._0_8_ = uVar93;
  auVar107 = pmaddwd(auVar52,auVar51);
  auVar50._2_2_ = uStack_f00;
  auVar50._0_2_ = uStack_ef0;
  auVar50._4_2_ = uStack_eee;
  auVar50._6_2_ = uStack_efe;
  auVar50._10_2_ = uStack_efc;
  auVar50._8_2_ = uStack_eec;
  auVar50._12_2_ = uStack_eea;
  auVar50._14_2_ = uStack_efa;
  auVar49._8_8_ = uVar94;
  auVar49._0_8_ = uVar93;
  auVar108 = pmaddwd(auVar50,auVar49);
  auVar48._2_2_ = local_1008;
  auVar48._0_2_ = local_ff8;
  auVar48._4_2_ = uStack_ff6;
  auVar48._6_2_ = uStack_1006;
  auVar48._10_2_ = uStack_1004;
  auVar48._8_2_ = uStack_ff4;
  auVar48._12_2_ = uStack_ff2;
  auVar48._14_2_ = uStack_1002;
  auVar47._8_8_ = uVar96;
  auVar47._0_8_ = uVar95;
  auVar109 = pmaddwd(auVar48,auVar47);
  auVar46._2_2_ = uStack_f00;
  auVar46._0_2_ = uStack_ef0;
  auVar46._4_2_ = uStack_eee;
  auVar46._6_2_ = uStack_efe;
  auVar46._10_2_ = uStack_efc;
  auVar46._8_2_ = uStack_eec;
  auVar46._12_2_ = uStack_eea;
  auVar46._14_2_ = uStack_efa;
  auVar45._8_8_ = uVar96;
  auVar45._0_8_ = uVar95;
  auVar110 = pmaddwd(auVar46,auVar45);
  local_758 = auVar107._0_4_;
  uStack_754 = auVar107._4_4_;
  uStack_750 = auVar107._8_4_;
  uStack_74c = auVar107._12_4_;
  local_778 = auVar108._0_4_;
  uStack_774 = auVar108._4_4_;
  uStack_770 = auVar108._8_4_;
  uStack_76c = auVar108._12_4_;
  local_798 = auVar109._0_4_;
  uStack_794 = auVar109._4_4_;
  uStack_790 = auVar109._8_4_;
  uStack_78c = auVar109._12_4_;
  local_7b8 = auVar110._0_4_;
  uStack_7b4 = auVar110._4_4_;
  uStack_7b0 = auVar110._8_4_;
  uStack_7ac = auVar110._12_4_;
  auVar107 = ZEXT416((uint)(int)in_DL);
  auVar108 = ZEXT416((uint)(int)in_DL);
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar88._4_4_ = uStack_754 + uStack_6e4 >> auVar107;
  auVar88._0_4_ = local_758 + local_6e8 >> auVar107;
  auVar88._12_4_ = uStack_74c + uStack_6dc >> auVar107;
  auVar88._8_4_ = uStack_750 + uStack_6e0 >> auVar107;
  auVar87._4_4_ = uStack_774 + uStack_6e4 >> auVar108;
  auVar87._0_4_ = local_778 + local_6e8 >> auVar108;
  auVar87._12_4_ = uStack_76c + uStack_6dc >> auVar108;
  auVar87._8_4_ = uStack_770 + uStack_6e0 >> auVar108;
  auVar107 = packssdw(auVar88,auVar87);
  *(undefined1 (*) [16])(in_RDI + 0x230) = auVar107;
  auVar86._4_4_ = uStack_794 + uStack_6e4 >> auVar109;
  auVar86._0_4_ = local_798 + local_6e8 >> auVar109;
  auVar86._12_4_ = uStack_78c + uStack_6dc >> auVar109;
  auVar86._8_4_ = uStack_790 + uStack_6e0 >> auVar109;
  auVar85._4_4_ = uStack_7b4 + uStack_6e4 >> auVar110;
  auVar85._0_4_ = local_7b8 + local_6e8 >> auVar110;
  auVar85._12_4_ = uStack_7ac + uStack_6dc >> auVar110;
  auVar85._8_4_ = uStack_7b0 + uStack_6e0 >> auVar110;
  auVar107 = packssdw(auVar86,auVar85);
  *(undefined1 (*) [16])(in_RDI + 0x3c0) = auVar107;
  uVar1 = *(undefined8 *)(in_RDI + 0x240);
  uVar2 = *(undefined8 *)(in_RDI + 0x3b0);
  local_1018 = (undefined2)uVar1;
  uStack_1016 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1014 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1012 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1028 = (undefined2)uVar2;
  uStack_1026 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1024 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1022 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x248);
  uVar2 = *(undefined8 *)(in_RDI + 0x3b8);
  uStack_f10 = (undefined2)uVar1;
  uStack_f0e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_f0c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_f0a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_f20 = (undefined2)uVar2;
  uStack_f1e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_f1c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_f1a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar44._2_2_ = local_1028;
  auVar44._0_2_ = local_1018;
  auVar44._4_2_ = uStack_1016;
  auVar44._6_2_ = uStack_1026;
  auVar44._10_2_ = uStack_1024;
  auVar44._8_2_ = uStack_1014;
  auVar44._12_2_ = uStack_1012;
  auVar44._14_2_ = uStack_1022;
  auVar43._8_8_ = uVar98;
  auVar43._0_8_ = uVar97;
  auVar107 = pmaddwd(auVar44,auVar43);
  auVar42._2_2_ = uStack_f20;
  auVar42._0_2_ = uStack_f10;
  auVar42._4_2_ = uStack_f0e;
  auVar42._6_2_ = uStack_f1e;
  auVar42._10_2_ = uStack_f1c;
  auVar42._8_2_ = uStack_f0c;
  auVar42._12_2_ = uStack_f0a;
  auVar42._14_2_ = uStack_f1a;
  auVar41._8_8_ = uVar98;
  auVar41._0_8_ = uVar97;
  auVar108 = pmaddwd(auVar42,auVar41);
  auVar40._2_2_ = local_1028;
  auVar40._0_2_ = local_1018;
  auVar40._4_2_ = uStack_1016;
  auVar40._6_2_ = uStack_1026;
  auVar40._10_2_ = uStack_1024;
  auVar40._8_2_ = uStack_1014;
  auVar40._12_2_ = uStack_1012;
  auVar40._14_2_ = uStack_1022;
  auVar39._8_8_ = uVar94;
  auVar39._0_8_ = uVar93;
  auVar109 = pmaddwd(auVar40,auVar39);
  auVar38._2_2_ = uStack_f20;
  auVar38._0_2_ = uStack_f10;
  auVar38._4_2_ = uStack_f0e;
  auVar38._6_2_ = uStack_f1e;
  auVar38._10_2_ = uStack_f1c;
  auVar38._8_2_ = uStack_f0c;
  auVar38._12_2_ = uStack_f0a;
  auVar38._14_2_ = uStack_f1a;
  auVar37._8_8_ = uVar94;
  auVar37._0_8_ = uVar93;
  auVar110 = pmaddwd(auVar38,auVar37);
  local_7d8 = auVar107._0_4_;
  uStack_7d4 = auVar107._4_4_;
  uStack_7d0 = auVar107._8_4_;
  uStack_7cc = auVar107._12_4_;
  local_7f8 = auVar108._0_4_;
  uStack_7f4 = auVar108._4_4_;
  uStack_7f0 = auVar108._8_4_;
  uStack_7ec = auVar108._12_4_;
  local_818 = auVar109._0_4_;
  uStack_814 = auVar109._4_4_;
  uStack_810 = auVar109._8_4_;
  uStack_80c = auVar109._12_4_;
  local_838 = auVar110._0_4_;
  uStack_834 = auVar110._4_4_;
  uStack_830 = auVar110._8_4_;
  uStack_82c = auVar110._12_4_;
  auVar107 = ZEXT416((uint)(int)in_DL);
  auVar108 = ZEXT416((uint)(int)in_DL);
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar84._4_4_ = uStack_7d4 + uStack_6e4 >> auVar107;
  auVar84._0_4_ = local_7d8 + local_6e8 >> auVar107;
  auVar84._12_4_ = uStack_7cc + uStack_6dc >> auVar107;
  auVar84._8_4_ = uStack_7d0 + uStack_6e0 >> auVar107;
  auVar83._4_4_ = uStack_7f4 + uStack_6e4 >> auVar108;
  auVar83._0_4_ = local_7f8 + local_6e8 >> auVar108;
  auVar83._12_4_ = uStack_7ec + uStack_6dc >> auVar108;
  auVar83._8_4_ = uStack_7f0 + uStack_6e0 >> auVar108;
  auVar107 = packssdw(auVar84,auVar83);
  *(undefined1 (*) [16])(in_RDI + 0x240) = auVar107;
  auVar82._4_4_ = uStack_814 + uStack_6e4 >> auVar109;
  auVar82._0_4_ = local_818 + local_6e8 >> auVar109;
  auVar82._12_4_ = uStack_80c + uStack_6dc >> auVar109;
  auVar82._8_4_ = uStack_810 + uStack_6e0 >> auVar109;
  auVar81._4_4_ = uStack_834 + uStack_6e4 >> auVar110;
  auVar81._0_4_ = local_838 + local_6e8 >> auVar110;
  auVar81._12_4_ = uStack_82c + uStack_6dc >> auVar110;
  auVar81._8_4_ = uStack_830 + uStack_6e0 >> auVar110;
  auVar107 = packssdw(auVar82,auVar81);
  *(undefined1 (*) [16])(in_RDI + 0x3b0) = auVar107;
  uVar1 = *(undefined8 *)(in_RDI + 0x250);
  uVar2 = *(undefined8 *)(in_RDI + 0x3a0);
  local_1038 = (undefined2)uVar1;
  uStack_1036 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1034 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1032 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1048 = (undefined2)uVar2;
  uStack_1046 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1044 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1042 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 600);
  uVar2 = *(undefined8 *)(in_RDI + 0x3a8);
  uStack_f30 = (undefined2)uVar1;
  uStack_f2e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_f2c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_f2a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_f40 = (undefined2)uVar2;
  uStack_f3e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_f3c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_f3a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar36._2_2_ = local_1048;
  auVar36._0_2_ = local_1038;
  auVar36._4_2_ = uStack_1036;
  auVar36._6_2_ = uStack_1046;
  auVar36._10_2_ = uStack_1044;
  auVar36._8_2_ = uStack_1034;
  auVar36._12_2_ = uStack_1032;
  auVar36._14_2_ = uStack_1042;
  auVar35._8_8_ = uVar98;
  auVar35._0_8_ = uVar97;
  auVar107 = pmaddwd(auVar36,auVar35);
  auVar34._2_2_ = uStack_f40;
  auVar34._0_2_ = uStack_f30;
  auVar34._4_2_ = uStack_f2e;
  auVar34._6_2_ = uStack_f3e;
  auVar34._10_2_ = uStack_f3c;
  auVar34._8_2_ = uStack_f2c;
  auVar34._12_2_ = uStack_f2a;
  auVar34._14_2_ = uStack_f3a;
  auVar33._8_8_ = uVar98;
  auVar33._0_8_ = uVar97;
  auVar108 = pmaddwd(auVar34,auVar33);
  auVar32._2_2_ = local_1048;
  auVar32._0_2_ = local_1038;
  auVar32._4_2_ = uStack_1036;
  auVar32._6_2_ = uStack_1046;
  auVar32._10_2_ = uStack_1044;
  auVar32._8_2_ = uStack_1034;
  auVar32._12_2_ = uStack_1032;
  auVar32._14_2_ = uStack_1042;
  auVar31._8_8_ = uVar94;
  auVar31._0_8_ = uVar93;
  auVar109 = pmaddwd(auVar32,auVar31);
  auVar30._2_2_ = uStack_f40;
  auVar30._0_2_ = uStack_f30;
  auVar30._4_2_ = uStack_f2e;
  auVar30._6_2_ = uStack_f3e;
  auVar30._10_2_ = uStack_f3c;
  auVar30._8_2_ = uStack_f2c;
  auVar30._12_2_ = uStack_f2a;
  auVar30._14_2_ = uStack_f3a;
  auVar29._8_8_ = uVar94;
  auVar29._0_8_ = uVar93;
  auVar110 = pmaddwd(auVar30,auVar29);
  local_858 = auVar107._0_4_;
  uStack_854 = auVar107._4_4_;
  uStack_850 = auVar107._8_4_;
  uStack_84c = auVar107._12_4_;
  local_878 = auVar108._0_4_;
  uStack_874 = auVar108._4_4_;
  uStack_870 = auVar108._8_4_;
  uStack_86c = auVar108._12_4_;
  local_898 = auVar109._0_4_;
  uStack_894 = auVar109._4_4_;
  uStack_890 = auVar109._8_4_;
  uStack_88c = auVar109._12_4_;
  local_8b8 = auVar110._0_4_;
  uStack_8b4 = auVar110._4_4_;
  uStack_8b0 = auVar110._8_4_;
  uStack_8ac = auVar110._12_4_;
  auVar107 = ZEXT416((uint)(int)in_DL);
  auVar108 = ZEXT416((uint)(int)in_DL);
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar80._4_4_ = uStack_854 + uStack_6e4 >> auVar107;
  auVar80._0_4_ = local_858 + local_6e8 >> auVar107;
  auVar80._12_4_ = uStack_84c + uStack_6dc >> auVar107;
  auVar80._8_4_ = uStack_850 + uStack_6e0 >> auVar107;
  auVar79._4_4_ = uStack_874 + uStack_6e4 >> auVar108;
  auVar79._0_4_ = local_878 + local_6e8 >> auVar108;
  auVar79._12_4_ = uStack_86c + uStack_6dc >> auVar108;
  auVar79._8_4_ = uStack_870 + uStack_6e0 >> auVar108;
  auVar107 = packssdw(auVar80,auVar79);
  *(undefined1 (*) [16])(in_RDI + 0x250) = auVar107;
  auVar78._4_4_ = uStack_894 + uStack_6e4 >> auVar109;
  auVar78._0_4_ = local_898 + local_6e8 >> auVar109;
  auVar78._12_4_ = uStack_88c + uStack_6dc >> auVar109;
  auVar78._8_4_ = uStack_890 + uStack_6e0 >> auVar109;
  auVar77._4_4_ = uStack_8b4 + uStack_6e4 >> auVar110;
  auVar77._0_4_ = local_8b8 + local_6e8 >> auVar110;
  auVar77._12_4_ = uStack_8ac + uStack_6dc >> auVar110;
  auVar77._8_4_ = uStack_8b0 + uStack_6e0 >> auVar110;
  auVar107 = packssdw(auVar78,auVar77);
  *(undefined1 (*) [16])(in_RDI + 0x3a0) = auVar107;
  uVar1 = *(undefined8 *)(in_RDI + 0x2a0);
  uVar2 = *(undefined8 *)(in_RDI + 0x350);
  local_1058 = (undefined2)uVar1;
  uStack_1056 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1054 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1052 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1068 = (undefined2)uVar2;
  uStack_1066 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1064 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1062 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x2a8);
  uVar2 = *(undefined8 *)(in_RDI + 0x358);
  uStack_f50 = (undefined2)uVar1;
  uStack_f4e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_f4c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_f4a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_f60 = (undefined2)uVar2;
  uStack_f5e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_f5c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_f5a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar28._2_2_ = local_1068;
  auVar28._0_2_ = local_1058;
  auVar28._4_2_ = uStack_1056;
  auVar28._6_2_ = uStack_1066;
  auVar28._10_2_ = uStack_1064;
  auVar28._8_2_ = uStack_1054;
  auVar28._12_2_ = uStack_1052;
  auVar28._14_2_ = uStack_1062;
  auVar27._8_8_ = uVar100;
  auVar27._0_8_ = uVar99;
  auVar107 = pmaddwd(auVar28,auVar27);
  auVar26._2_2_ = uStack_f60;
  auVar26._0_2_ = uStack_f50;
  auVar26._4_2_ = uStack_f4e;
  auVar26._6_2_ = uStack_f5e;
  auVar26._10_2_ = uStack_f5c;
  auVar26._8_2_ = uStack_f4c;
  auVar26._12_2_ = uStack_f4a;
  auVar26._14_2_ = uStack_f5a;
  auVar25._8_8_ = uVar100;
  auVar25._0_8_ = uVar99;
  auVar108 = pmaddwd(auVar26,auVar25);
  auVar24._2_2_ = local_1068;
  auVar24._0_2_ = local_1058;
  auVar24._4_2_ = uStack_1056;
  auVar24._6_2_ = uStack_1066;
  auVar24._10_2_ = uStack_1064;
  auVar24._8_2_ = uStack_1054;
  auVar24._12_2_ = uStack_1052;
  auVar24._14_2_ = uStack_1062;
  auVar23._8_8_ = uVar102;
  auVar23._0_8_ = uVar101;
  auVar109 = pmaddwd(auVar24,auVar23);
  auVar22._2_2_ = uStack_f60;
  auVar22._0_2_ = uStack_f50;
  auVar22._4_2_ = uStack_f4e;
  auVar22._6_2_ = uStack_f5e;
  auVar22._10_2_ = uStack_f5c;
  auVar22._8_2_ = uStack_f4c;
  auVar22._12_2_ = uStack_f4a;
  auVar22._14_2_ = uStack_f5a;
  auVar21._8_8_ = uVar102;
  auVar21._0_8_ = uVar101;
  auVar110 = pmaddwd(auVar22,auVar21);
  local_8d8 = auVar107._0_4_;
  uStack_8d4 = auVar107._4_4_;
  uStack_8d0 = auVar107._8_4_;
  uStack_8cc = auVar107._12_4_;
  local_8f8 = auVar108._0_4_;
  uStack_8f4 = auVar108._4_4_;
  uStack_8f0 = auVar108._8_4_;
  uStack_8ec = auVar108._12_4_;
  local_918 = auVar109._0_4_;
  uStack_914 = auVar109._4_4_;
  uStack_910 = auVar109._8_4_;
  uStack_90c = auVar109._12_4_;
  local_938 = auVar110._0_4_;
  uStack_934 = auVar110._4_4_;
  uStack_930 = auVar110._8_4_;
  uStack_92c = auVar110._12_4_;
  auVar107 = ZEXT416((uint)(int)in_DL);
  auVar108 = ZEXT416((uint)(int)in_DL);
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar76._4_4_ = uStack_8d4 + uStack_6e4 >> auVar107;
  auVar76._0_4_ = local_8d8 + local_6e8 >> auVar107;
  auVar76._12_4_ = uStack_8cc + uStack_6dc >> auVar107;
  auVar76._8_4_ = uStack_8d0 + uStack_6e0 >> auVar107;
  auVar75._4_4_ = uStack_8f4 + uStack_6e4 >> auVar108;
  auVar75._0_4_ = local_8f8 + local_6e8 >> auVar108;
  auVar75._12_4_ = uStack_8ec + uStack_6dc >> auVar108;
  auVar75._8_4_ = uStack_8f0 + uStack_6e0 >> auVar108;
  auVar107 = packssdw(auVar76,auVar75);
  *(undefined1 (*) [16])(in_RDI + 0x2a0) = auVar107;
  auVar74._4_4_ = uStack_914 + uStack_6e4 >> auVar109;
  auVar74._0_4_ = local_918 + local_6e8 >> auVar109;
  auVar74._12_4_ = uStack_90c + uStack_6dc >> auVar109;
  auVar74._8_4_ = uStack_910 + uStack_6e0 >> auVar109;
  auVar73._4_4_ = uStack_934 + uStack_6e4 >> auVar110;
  auVar73._0_4_ = local_938 + local_6e8 >> auVar110;
  auVar73._12_4_ = uStack_92c + uStack_6dc >> auVar110;
  auVar73._8_4_ = uStack_930 + uStack_6e0 >> auVar110;
  auVar107 = packssdw(auVar74,auVar73);
  *(undefined1 (*) [16])(in_RDI + 0x350) = auVar107;
  uVar1 = *(undefined8 *)(in_RDI + 0x2b0);
  uVar2 = *(undefined8 *)(in_RDI + 0x340);
  local_1078 = (undefined2)uVar1;
  uStack_1076 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1074 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1072 = (undefined2)((ulong)uVar1 >> 0x30);
  local_1088 = (undefined2)uVar2;
  uStack_1086 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_1084 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_1082 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x2b8);
  uVar2 = *(undefined8 *)(in_RDI + 0x348);
  uStack_f70 = (undefined2)uVar1;
  uStack_f6e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_f6c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_f6a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_f80 = (undefined2)uVar2;
  uStack_f7e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_f7c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_f7a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar20._2_2_ = local_1088;
  auVar20._0_2_ = local_1078;
  auVar20._4_2_ = uStack_1076;
  auVar20._6_2_ = uStack_1086;
  auVar20._10_2_ = uStack_1084;
  auVar20._8_2_ = uStack_1074;
  auVar20._12_2_ = uStack_1072;
  auVar20._14_2_ = uStack_1082;
  auVar19._8_8_ = uVar100;
  auVar19._0_8_ = uVar99;
  auVar107 = pmaddwd(auVar20,auVar19);
  auVar18._2_2_ = uStack_f80;
  auVar18._0_2_ = uStack_f70;
  auVar18._4_2_ = uStack_f6e;
  auVar18._6_2_ = uStack_f7e;
  auVar18._10_2_ = uStack_f7c;
  auVar18._8_2_ = uStack_f6c;
  auVar18._12_2_ = uStack_f6a;
  auVar18._14_2_ = uStack_f7a;
  auVar17._8_8_ = uVar100;
  auVar17._0_8_ = uVar99;
  auVar108 = pmaddwd(auVar18,auVar17);
  auVar16._2_2_ = local_1088;
  auVar16._0_2_ = local_1078;
  auVar16._4_2_ = uStack_1076;
  auVar16._6_2_ = uStack_1086;
  auVar16._10_2_ = uStack_1084;
  auVar16._8_2_ = uStack_1074;
  auVar16._12_2_ = uStack_1072;
  auVar16._14_2_ = uStack_1082;
  auVar15._8_8_ = uVar102;
  auVar15._0_8_ = uVar101;
  auVar109 = pmaddwd(auVar16,auVar15);
  auVar14._2_2_ = uStack_f80;
  auVar14._0_2_ = uStack_f70;
  auVar14._4_2_ = uStack_f6e;
  auVar14._6_2_ = uStack_f7e;
  auVar14._10_2_ = uStack_f7c;
  auVar14._8_2_ = uStack_f6c;
  auVar14._12_2_ = uStack_f6a;
  auVar14._14_2_ = uStack_f7a;
  auVar13._8_8_ = uVar102;
  auVar13._0_8_ = uVar101;
  auVar110 = pmaddwd(auVar14,auVar13);
  local_958 = auVar107._0_4_;
  uStack_954 = auVar107._4_4_;
  uStack_950 = auVar107._8_4_;
  uStack_94c = auVar107._12_4_;
  local_978 = auVar108._0_4_;
  uStack_974 = auVar108._4_4_;
  uStack_970 = auVar108._8_4_;
  uStack_96c = auVar108._12_4_;
  local_998 = auVar109._0_4_;
  uStack_994 = auVar109._4_4_;
  uStack_990 = auVar109._8_4_;
  uStack_98c = auVar109._12_4_;
  local_9b8 = auVar110._0_4_;
  uStack_9b4 = auVar110._4_4_;
  uStack_9b0 = auVar110._8_4_;
  uStack_9ac = auVar110._12_4_;
  auVar107 = ZEXT416((uint)(int)in_DL);
  auVar108 = ZEXT416((uint)(int)in_DL);
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar72._4_4_ = uStack_954 + uStack_6e4 >> auVar107;
  auVar72._0_4_ = local_958 + local_6e8 >> auVar107;
  auVar72._12_4_ = uStack_94c + uStack_6dc >> auVar107;
  auVar72._8_4_ = uStack_950 + uStack_6e0 >> auVar107;
  auVar71._4_4_ = uStack_974 + uStack_6e4 >> auVar108;
  auVar71._0_4_ = local_978 + local_6e8 >> auVar108;
  auVar71._12_4_ = uStack_96c + uStack_6dc >> auVar108;
  auVar71._8_4_ = uStack_970 + uStack_6e0 >> auVar108;
  auVar107 = packssdw(auVar72,auVar71);
  *(undefined1 (*) [16])(in_RDI + 0x2b0) = auVar107;
  auVar70._4_4_ = uStack_994 + uStack_6e4 >> auVar109;
  auVar70._0_4_ = local_998 + local_6e8 >> auVar109;
  auVar70._12_4_ = uStack_98c + uStack_6dc >> auVar109;
  auVar70._8_4_ = uStack_990 + uStack_6e0 >> auVar109;
  auVar69._4_4_ = uStack_9b4 + uStack_6e4 >> auVar110;
  auVar69._0_4_ = local_9b8 + local_6e8 >> auVar110;
  auVar69._12_4_ = uStack_9ac + uStack_6dc >> auVar110;
  auVar69._8_4_ = uStack_9b0 + uStack_6e0 >> auVar110;
  auVar107 = packssdw(auVar70,auVar69);
  *(undefined1 (*) [16])(in_RDI + 0x340) = auVar107;
  uVar1 = *(undefined8 *)(in_RDI + 0x2c0);
  uVar2 = *(undefined8 *)(in_RDI + 0x330);
  local_1098 = (undefined2)uVar1;
  uStack_1096 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_1094 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_1092 = (undefined2)((ulong)uVar1 >> 0x30);
  local_10a8 = (undefined2)uVar2;
  uStack_10a6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_10a4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_10a2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x2c8);
  uVar2 = *(undefined8 *)(in_RDI + 0x338);
  uStack_f90 = (undefined2)uVar1;
  uStack_f8e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_f8c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_f8a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_fa0 = (undefined2)uVar2;
  uStack_f9e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_f9c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_f9a = (undefined2)((ulong)uVar2 >> 0x30);
  auVar12._2_2_ = local_10a8;
  auVar12._0_2_ = local_1098;
  auVar12._4_2_ = uStack_1096;
  auVar12._6_2_ = uStack_10a6;
  auVar12._10_2_ = uStack_10a4;
  auVar12._8_2_ = uStack_1094;
  auVar12._12_2_ = uStack_1092;
  auVar12._14_2_ = uStack_10a2;
  auVar11._8_8_ = uVar104;
  auVar11._0_8_ = uVar103;
  auVar107 = pmaddwd(auVar12,auVar11);
  auVar10._2_2_ = uStack_fa0;
  auVar10._0_2_ = uStack_f90;
  auVar10._4_2_ = uStack_f8e;
  auVar10._6_2_ = uStack_f9e;
  auVar10._10_2_ = uStack_f9c;
  auVar10._8_2_ = uStack_f8c;
  auVar10._12_2_ = uStack_f8a;
  auVar10._14_2_ = uStack_f9a;
  auVar9._8_8_ = uVar104;
  auVar9._0_8_ = uVar103;
  auVar108 = pmaddwd(auVar10,auVar9);
  auVar8._2_2_ = local_10a8;
  auVar8._0_2_ = local_1098;
  auVar8._4_2_ = uStack_1096;
  auVar8._6_2_ = uStack_10a6;
  auVar8._10_2_ = uStack_10a4;
  auVar8._8_2_ = uStack_1094;
  auVar8._12_2_ = uStack_1092;
  auVar8._14_2_ = uStack_10a2;
  auVar7._8_8_ = uVar100;
  auVar7._0_8_ = uVar99;
  auVar109 = pmaddwd(auVar8,auVar7);
  auVar6._2_2_ = uStack_fa0;
  auVar6._0_2_ = uStack_f90;
  auVar6._4_2_ = uStack_f8e;
  auVar6._6_2_ = uStack_f9e;
  auVar6._10_2_ = uStack_f9c;
  auVar6._8_2_ = uStack_f8c;
  auVar6._12_2_ = uStack_f8a;
  auVar6._14_2_ = uStack_f9a;
  auVar5._8_8_ = uVar100;
  auVar5._0_8_ = uVar99;
  auVar110 = pmaddwd(auVar6,auVar5);
  local_9d8 = auVar107._0_4_;
  uStack_9d4 = auVar107._4_4_;
  uStack_9d0 = auVar107._8_4_;
  uStack_9cc = auVar107._12_4_;
  local_9f8 = auVar108._0_4_;
  uStack_9f4 = auVar108._4_4_;
  uStack_9f0 = auVar108._8_4_;
  uStack_9ec = auVar108._12_4_;
  local_a18 = auVar109._0_4_;
  uStack_a14 = auVar109._4_4_;
  uStack_a10 = auVar109._8_4_;
  uStack_a0c = auVar109._12_4_;
  local_a38 = auVar110._0_4_;
  uStack_a34 = auVar110._4_4_;
  uStack_a30 = auVar110._8_4_;
  uStack_a2c = auVar110._12_4_;
  auVar107 = ZEXT416((uint)(int)in_DL);
  auVar108 = ZEXT416((uint)(int)in_DL);
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar68._4_4_ = uStack_9d4 + uStack_6e4 >> auVar107;
  auVar68._0_4_ = local_9d8 + local_6e8 >> auVar107;
  auVar68._12_4_ = uStack_9cc + uStack_6dc >> auVar107;
  auVar68._8_4_ = uStack_9d0 + uStack_6e0 >> auVar107;
  auVar67._4_4_ = uStack_9f4 + uStack_6e4 >> auVar108;
  auVar67._0_4_ = local_9f8 + local_6e8 >> auVar108;
  auVar67._12_4_ = uStack_9ec + uStack_6dc >> auVar108;
  auVar67._8_4_ = uStack_9f0 + uStack_6e0 >> auVar108;
  auVar107 = packssdw(auVar68,auVar67);
  *(undefined1 (*) [16])(in_RDI + 0x2c0) = auVar107;
  auVar66._4_4_ = uStack_a14 + uStack_6e4 >> auVar109;
  auVar66._0_4_ = local_a18 + local_6e8 >> auVar109;
  auVar66._12_4_ = uStack_a0c + uStack_6dc >> auVar109;
  auVar66._8_4_ = uStack_a10 + uStack_6e0 >> auVar109;
  auVar65._4_4_ = uStack_a34 + uStack_6e4 >> auVar110;
  auVar65._0_4_ = local_a38 + local_6e8 >> auVar110;
  auVar65._12_4_ = uStack_a2c + uStack_6dc >> auVar110;
  auVar65._8_4_ = uStack_a30 + uStack_6e0 >> auVar110;
  auVar107 = packssdw(auVar66,auVar65);
  *(undefined1 (*) [16])(in_RDI + 0x330) = auVar107;
  uVar1 = *(undefined8 *)(in_RDI + 0x2d0);
  uVar2 = *(undefined8 *)(in_RDI + 800);
  local_10b8 = (undefined2)uVar1;
  uStack_10b6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_10b4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_10b2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_10c8 = (undefined2)uVar2;
  uStack_10c6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_10c4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_10c2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = *(undefined8 *)(in_RDI + 0x2d8);
  uVar2 = *(undefined8 *)(in_RDI + 0x328);
  uStack_fb0 = (undefined2)uVar1;
  uStack_fae = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_fac = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_faa = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_fc0 = (undefined2)uVar2;
  uStack_fbe = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_fbc = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_fba = (undefined2)((ulong)uVar2 >> 0x30);
  auVar4._2_2_ = local_10c8;
  auVar4._0_2_ = local_10b8;
  auVar4._4_2_ = uStack_10b6;
  auVar4._6_2_ = uStack_10c6;
  auVar4._10_2_ = uStack_10c4;
  auVar4._8_2_ = uStack_10b4;
  auVar4._12_2_ = uStack_10b2;
  auVar4._14_2_ = uStack_10c2;
  auVar111._8_8_ = uVar104;
  auVar111._0_8_ = uVar103;
  auVar111 = pmaddwd(auVar4,auVar111);
  auVar3._2_2_ = uStack_fc0;
  auVar3._0_2_ = uStack_fb0;
  auVar3._4_2_ = uStack_fae;
  auVar3._6_2_ = uStack_fbe;
  auVar3._10_2_ = uStack_fbc;
  auVar3._8_2_ = uStack_fac;
  auVar3._12_2_ = uStack_faa;
  auVar3._14_2_ = uStack_fba;
  auVar112._8_8_ = uVar104;
  auVar112._0_8_ = uVar103;
  auVar112 = pmaddwd(auVar3,auVar112);
  auVar110._2_2_ = local_10c8;
  auVar110._0_2_ = local_10b8;
  auVar110._4_2_ = uStack_10b6;
  auVar110._6_2_ = uStack_10c6;
  auVar110._10_2_ = uStack_10c4;
  auVar110._8_2_ = uStack_10b4;
  auVar110._12_2_ = uStack_10b2;
  auVar110._14_2_ = uStack_10c2;
  auVar109._8_8_ = uVar100;
  auVar109._0_8_ = uVar99;
  auVar109 = pmaddwd(auVar110,auVar109);
  auVar108._2_2_ = uStack_fc0;
  auVar108._0_2_ = uStack_fb0;
  auVar108._4_2_ = uStack_fae;
  auVar108._6_2_ = uStack_fbe;
  auVar108._10_2_ = uStack_fbc;
  auVar108._8_2_ = uStack_fac;
  auVar108._12_2_ = uStack_faa;
  auVar108._14_2_ = uStack_fba;
  auVar107._8_8_ = uVar100;
  auVar107._0_8_ = uVar99;
  auVar107 = pmaddwd(auVar108,auVar107);
  local_a58 = auVar111._0_4_;
  uStack_a54 = auVar111._4_4_;
  uStack_a50 = auVar111._8_4_;
  uStack_a4c = auVar111._12_4_;
  local_a78 = auVar112._0_4_;
  uStack_a74 = auVar112._4_4_;
  uStack_a70 = auVar112._8_4_;
  uStack_a6c = auVar112._12_4_;
  local_a98 = auVar109._0_4_;
  uStack_a94 = auVar109._4_4_;
  uStack_a90 = auVar109._8_4_;
  uStack_a8c = auVar109._12_4_;
  local_ab8 = auVar107._0_4_;
  uStack_ab4 = auVar107._4_4_;
  uStack_ab0 = auVar107._8_4_;
  uStack_aac = auVar107._12_4_;
  auVar107 = ZEXT416((uint)(int)in_DL);
  auVar108 = ZEXT416((uint)(int)in_DL);
  auVar109 = ZEXT416((uint)(int)in_DL);
  auVar110 = ZEXT416((uint)(int)in_DL);
  auVar64._4_4_ = uStack_a54 + uStack_6e4 >> auVar107;
  auVar64._0_4_ = local_a58 + local_6e8 >> auVar107;
  auVar64._12_4_ = uStack_a4c + uStack_6dc >> auVar107;
  auVar64._8_4_ = uStack_a50 + uStack_6e0 >> auVar107;
  auVar63._4_4_ = uStack_a74 + uStack_6e4 >> auVar108;
  auVar63._0_4_ = local_a78 + local_6e8 >> auVar108;
  auVar63._12_4_ = uStack_a6c + uStack_6dc >> auVar108;
  auVar63._8_4_ = uStack_a70 + uStack_6e0 >> auVar108;
  auVar107 = packssdw(auVar64,auVar63);
  *(undefined1 (*) [16])(in_RDI + 0x2d0) = auVar107;
  auVar62._4_4_ = uStack_a94 + uStack_6e4 >> auVar109;
  auVar62._0_4_ = local_a98 + local_6e8 >> auVar109;
  auVar62._12_4_ = uStack_a8c + uStack_6dc >> auVar109;
  auVar62._8_4_ = uStack_a90 + uStack_6e0 >> auVar109;
  auVar61._4_4_ = uStack_ab4 + uStack_6e4 >> auVar110;
  auVar61._0_4_ = local_ab8 + local_6e8 >> auVar110;
  auVar61._12_4_ = uStack_aac + uStack_6dc >> auVar110;
  auVar61._8_4_ = uStack_ab0 + uStack_6e0 >> auVar110;
  auVar107 = packssdw(auVar62,auVar61);
  *(undefined1 (*) [16])(in_RDI + 800) = auVar107;
  return;
}

Assistant:

static inline void idct64_stage6_high32_sse2(__m128i *x, const int32_t *cospi,
                                             const __m128i __rounding,
                                             int8_t cos_bit) {
  const __m128i cospi_m08_p56 = pair_set_epi16(-cospi[8], cospi[56]);
  const __m128i cospi_p56_p08 = pair_set_epi16(cospi[56], cospi[8]);
  const __m128i cospi_m56_m08 = pair_set_epi16(-cospi[56], -cospi[8]);
  const __m128i cospi_m40_p24 = pair_set_epi16(-cospi[40], cospi[24]);
  const __m128i cospi_p24_p40 = pair_set_epi16(cospi[24], cospi[40]);
  const __m128i cospi_m24_m40 = pair_set_epi16(-cospi[24], -cospi[40]);
  btf_16_sse2(cospi_m08_p56, cospi_p56_p08, x[34], x[61], x[34], x[61]);
  btf_16_sse2(cospi_m08_p56, cospi_p56_p08, x[35], x[60], x[35], x[60]);
  btf_16_sse2(cospi_m56_m08, cospi_m08_p56, x[36], x[59], x[36], x[59]);
  btf_16_sse2(cospi_m56_m08, cospi_m08_p56, x[37], x[58], x[37], x[58]);
  btf_16_sse2(cospi_m40_p24, cospi_p24_p40, x[42], x[53], x[42], x[53]);
  btf_16_sse2(cospi_m40_p24, cospi_p24_p40, x[43], x[52], x[43], x[52]);
  btf_16_sse2(cospi_m24_m40, cospi_m40_p24, x[44], x[51], x[44], x[51]);
  btf_16_sse2(cospi_m24_m40, cospi_m40_p24, x[45], x[50], x[45], x[50]);
}